

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Value * __thiscall
soul::heart::Parser::parseNaNandInfinityTokens(Value *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  float fVar2;
  double dVar3;
  Parser *this_local;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"_inf32");
  if (bVar1) {
    fVar2 = std::numeric_limits<float>::infinity();
    soul::Value::Value(__return_storage_ptr__,fVar2);
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"_ninf32");
    if (bVar1) {
      fVar2 = std::numeric_limits<float>::infinity();
      soul::Value::Value(__return_storage_ptr__,-fVar2);
    }
    else {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"_nan32");
      if (bVar1) {
        fVar2 = std::numeric_limits<float>::quiet_NaN();
        soul::Value::Value(__return_storage_ptr__,fVar2);
      }
      else {
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                ::matchIf<char_const*>
                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            *)this,"_inf64");
        if (bVar1) {
          dVar3 = std::numeric_limits<double>::infinity();
          soul::Value::Value(__return_storage_ptr__,dVar3);
        }
        else {
          bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                  ::matchIf<char_const*>
                            ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                              *)this,"_ninf64");
          if (bVar1) {
            dVar3 = std::numeric_limits<double>::infinity();
            soul::Value::Value(__return_storage_ptr__,-dVar3);
          }
          else {
            bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                    ::matchIf<char_const*>
                              ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                *)this,"_nan64");
            if (bVar1) {
              dVar3 = std::numeric_limits<double>::quiet_NaN();
              soul::Value::Value(__return_storage_ptr__,dVar3);
            }
            else {
              soul::Value::Value(__return_storage_ptr__);
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value parseNaNandInfinityTokens()
    {
        if (matchIf ("_inf32"))     return soul::Value ( std::numeric_limits<float>::infinity());
        if (matchIf ("_ninf32"))    return soul::Value (-std::numeric_limits<float>::infinity());
        if (matchIf ("_nan32"))     return soul::Value ( std::numeric_limits<float>::quiet_NaN());

        if (matchIf ("_inf64"))     return soul::Value ( std::numeric_limits<double>::infinity());
        if (matchIf ("_ninf64"))    return soul::Value (-std::numeric_limits<double>::infinity());
        if (matchIf ("_nan64"))     return soul::Value ( std::numeric_limits<double>::quiet_NaN());

        return {};
    }